

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::Lexer(Lexer *this,SyntaxTree *tree)

{
  string *psVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  SyntaxTree *tree_local;
  Lexer *this_local;
  
  this->tree_ = tree;
  SyntaxTree::text(tree);
  psVar1 = (string *)psy::SourceText::rawText_abi_cxx11_();
  std::__cxx11::string::string((string *)&this->text_,psVar1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  this->c_strBeg_ = pcVar2;
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::size();
  this->c_strEnd_ = (char *)(lVar3 + lVar4);
  this->yytext_ = this->c_strBeg_ + -1;
  this->yy_ = this->yytext_;
  this->yychar_ = '\n';
  this->yylineno_ = 1;
  this->yycolumn_ = 0;
  this->offset_ = 0xffffffff;
  this->withinLogicalLine_ = false;
  this->syntaxK_splitTk = EndOfFile;
  DiagnosticsReporter::DiagnosticsReporter(&this->diagReporter_,this);
  return;
}

Assistant:

Lexer::Lexer(SyntaxTree* tree)
    : tree_(tree)
    , text_(tree->text().rawText())
    , c_strBeg_(text_.c_str())
    , c_strEnd_(text_.c_str() + text_.size())
    , yytext_(c_strBeg_ - 1)
    , yy_(yytext_)
    , yychar_('\n')
    , yylineno_(1)
    , yycolumn_(0)
    , offset_(~0)  // Start immediately "before" 0.
    , withinLogicalLine_(false)
    , syntaxK_splitTk(SyntaxKind::EndOfFile)
    , diagReporter_(this)
{}